

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

int FindResponseDescriptorRPLIDAR
              (uchar *buf,int buflen,int *pDataResponseLength,int *pSendMode,int *pDataType,
              int *pnbBytesToRequest,uchar **pFoundResponseDescriptor,int *pnbBytesDiscarded)

{
  int iVar1;
  int nbBytesToDiscard;
  int nbBytesToRequest;
  int *local_38;
  
  nbBytesToRequest = -1;
  nbBytesToDiscard = 0;
  *pnbBytesToRequest = -1;
  *pFoundResponseDescriptor = buf;
  *pnbBytesDiscarded = 0;
  iVar1 = 0;
  local_38 = pnbBytesToRequest;
  while( true ) {
    iVar1 = AnalyzeResponseDescriptorRPLIDAR
                      (buf,buflen - iVar1,pDataResponseLength,pSendMode,pDataType,&nbBytesToRequest,
                       &nbBytesToDiscard);
    if (iVar1 == 0) {
      return 0;
    }
    if (iVar1 == 6) break;
    buf = *pFoundResponseDescriptor + nbBytesToDiscard;
    *pFoundResponseDescriptor = buf;
    iVar1 = *pnbBytesDiscarded + nbBytesToDiscard;
    *pnbBytesDiscarded = iVar1;
    if (buflen <= iVar1) {
      *pFoundResponseDescriptor = (uchar *)0x0;
      return 1;
    }
  }
  *local_38 = nbBytesToRequest;
  return 6;
}

Assistant:

inline int FindResponseDescriptorRPLIDAR(unsigned char* buf, int buflen, int* pDataResponseLength, int* pSendMode, int* pDataType, 
						 int* pnbBytesToRequest, unsigned char** pFoundResponseDescriptor, int* pnbBytesDiscarded)
{
	int res = EXIT_FAILURE, nbBytesToRequest = -1, nbBytesToDiscard = 0;

	*pnbBytesToRequest = -1;
	*pFoundResponseDescriptor = buf;
	*pnbBytesDiscarded = 0;

	for (;;)
	{
		res = AnalyzeResponseDescriptorRPLIDAR(*pFoundResponseDescriptor, buflen-(*pnbBytesDiscarded), pDataResponseLength, pSendMode, pDataType, &nbBytesToRequest, &nbBytesToDiscard);
		switch (res)
		{
		case EXIT_SUCCESS:
			return EXIT_SUCCESS;
		case EXIT_OUT_OF_MEMORY:
			(*pnbBytesToRequest) = nbBytesToRequest;
			return EXIT_OUT_OF_MEMORY;
		default:
			(*pFoundResponseDescriptor) += nbBytesToDiscard;
			(*pnbBytesDiscarded) += nbBytesToDiscard;
			if (buflen-(*pnbBytesDiscarded) <= 0)
			{
				*pFoundResponseDescriptor = NULL;
				return EXIT_FAILURE;
			}
			break;
		}
	} 
}